

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVProcessChain.cxx
# Opt level: O3

cmUVProcessChain * __thiscall
cmUVProcessChain::operator=(cmUVProcessChain *this,cmUVProcessChain *other)

{
  _Head_base<0UL,_cmUVProcessChain::InternalData_*,_false> _Var1;
  _Head_base<0UL,_cmUVProcessChain::InternalData_*,_false> __ptr;
  
  _Var1._M_head_impl =
       (other->Data)._M_t.
       super___uniq_ptr_impl<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
       ._M_t.
       super__Tuple_impl<0UL,_cmUVProcessChain::InternalData_*,_std::default_delete<cmUVProcessChain::InternalData>_>
       .super__Head_base<0UL,_cmUVProcessChain::InternalData_*,_false>._M_head_impl;
  (other->Data)._M_t.
  super___uniq_ptr_impl<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
  ._M_t.
  super__Tuple_impl<0UL,_cmUVProcessChain::InternalData_*,_std::default_delete<cmUVProcessChain::InternalData>_>
  .super__Head_base<0UL,_cmUVProcessChain::InternalData_*,_false>._M_head_impl = (InternalData *)0x0
  ;
  __ptr._M_head_impl =
       (this->Data)._M_t.
       super___uniq_ptr_impl<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
       ._M_t.
       super__Tuple_impl<0UL,_cmUVProcessChain::InternalData_*,_std::default_delete<cmUVProcessChain::InternalData>_>
       .super__Head_base<0UL,_cmUVProcessChain::InternalData_*,_false>._M_head_impl;
  (this->Data)._M_t.
  super___uniq_ptr_impl<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
  ._M_t.
  super__Tuple_impl<0UL,_cmUVProcessChain::InternalData_*,_std::default_delete<cmUVProcessChain::InternalData>_>
  .super__Head_base<0UL,_cmUVProcessChain::InternalData_*,_false>._M_head_impl = _Var1._M_head_impl;
  if (__ptr._M_head_impl != (InternalData *)0x0) {
    std::default_delete<cmUVProcessChain::InternalData>::operator()
              ((default_delete<cmUVProcessChain::InternalData> *)this,__ptr._M_head_impl);
  }
  return this;
}

Assistant:

cmUVProcessChain& cmUVProcessChain::operator=(
  cmUVProcessChain&& other) noexcept
{
  this->Data = std::move(other.Data);
  return *this;
}